

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

CURLcode http_output_bearer(Curl_easy *data)

{
  char **ppcVar1;
  char *pcVar2;
  CURLcode local_1c;
  CURLcode result;
  char **userp;
  Curl_easy *data_local;
  
  local_1c = CURLE_OK;
  ppcVar1 = &(data->state).aptr.userpwd;
  (*Curl_cfree)(*ppcVar1);
  pcVar2 = curl_maprintf("Authorization: Bearer %s\r\n",(data->set).str[0x41]);
  *ppcVar1 = pcVar2;
  if (*ppcVar1 == (char *)0x0) {
    local_1c = CURLE_OUT_OF_MEMORY;
  }
  return local_1c;
}

Assistant:

static CURLcode http_output_bearer(struct Curl_easy *data)
{
  char **userp;
  CURLcode result = CURLE_OK;

  userp = &data->state.aptr.userpwd;
  free(*userp);
  *userp = aprintf("Authorization: Bearer %s\r\n",
                   data->set.str[STRING_BEARER]);

  if(!*userp) {
    result = CURLE_OUT_OF_MEMORY;
    goto fail;
  }

  fail:
  return result;
}